

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::verify_block_hashes(torrent *this,piece_index_t index)

{
  bool bVar1;
  uint uVar2;
  pointer this_00;
  torrent *this_local;
  piece_index_t index_local;
  
  this_local._4_4_ = index.m_val;
  need_hash_picker(this);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr *)&(this->super_torrent_hot_members).m_hash_picker);
  if (bVar1) {
    uVar2 = (*(this->super_request_callback)._vptr_request_callback[6])();
    if ((uVar2 & 1) != 0) {
      uVar2 = strong_typedef::operator_cast_to_int((strong_typedef *)((long)&this_local + 4));
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"Piece %d hash failure, requesting block hashes",(ulong)uVar2);
    }
    this_00 = ::std::
              unique_ptr<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
              ::operator->(&(this->super_torrent_hot_members).m_hash_picker);
    hash_picker::verify_block_hashes(this_00,this_local._4_4_);
  }
  return;
}

Assistant:

void torrent::verify_block_hashes(piece_index_t index)
	{
		need_hash_picker();
		if (!m_hash_picker) return;
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			debug_log("Piece %d hash failure, requesting block hashes", int(index));
		}
#endif
		m_hash_picker->verify_block_hashes(index);
	}